

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O1

process_events_map_t *
tchecker::system::weakly_synchronized_events
          (process_events_map_t *__return_storage_ptr__,system_t *system)

{
  pointer psVar1;
  __normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>
  _Var2;
  sync_constraint_t *sc;
  pointer psVar3;
  synchronization_t *sync;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
  rVar4;
  allocator_type local_29;
  
  std::
  vector<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>
  ::vector(&__return_storage_ptr__->_map,
           (ulong)(uint)((int)((ulong)((long)(system->super_processes_t)._procs_attributes.
                                             super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(system->super_processes_t)._procs_attributes.
                                            super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x49249249),&local_29);
  rVar4 = synchronizations_t::synchronizations(&system->super_synchronizations_t);
  for (_Var2 = rVar4._begin._M_current; _Var2._M_current != rVar4._end._M_current._M_current;
      _Var2._M_current = _Var2._M_current + 1) {
    psVar1 = ((_Var2._M_current)->_constraints).
             super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar3 = ((_Var2._M_current)->_constraints).
                  super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1)
    {
      if (psVar3->_strength == SYNC_WEAK) {
        process_events_map_t::insert(__return_storage_ptr__,psVar3->_pid,psVar3->_event_id);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tchecker::system::process_events_map_t weakly_synchronized_events(tchecker::system::system_t const & system)
{
  tchecker::system::process_events_map_t weak_sync_map(system.processes_count());
  for (tchecker::system::synchronization_t const & sync : system.synchronizations()) {
    for (tchecker::system::sync_constraint_t const & sc : sync.synchronization_constraints())
      if (sc.strength() == tchecker::SYNC_WEAK)
        weak_sync_map.insert(sc.pid(), sc.event_id());
  }
  return weak_sync_map;
}